

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_containers.cpp
# Opt level: O3

ostream * operator<<(ostream *ostream,RGB rgb)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"R=",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)ostream);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," G=",3);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," B=",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return ostream;
}

Assistant:

std::ostream& operator<<(std::ostream& ostream, RGB rgb) {

    ostream << "R=" << static_cast<std::uint32_t>(rgb.r) << " G=" << static_cast<std::uint32_t>(rgb.g) << " B=" << static_cast<std::uint32_t>(rgb.b);
    return ostream;
  }